

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMElementNSImpl.cpp
# Opt level: O3

void __thiscall
xercesc_4_0::DOMElementNSImpl::setName
          (DOMElementNSImpl *this,XMLCh *namespaceURI,XMLCh *qualifiedName)

{
  short *psVar1;
  short *psVar2;
  DOMDocument *pDVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  ulong uVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  XMLCh *pXVar9;
  long lVar10;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  DOMException *this_00;
  undefined4 extraout_var_04;
  undefined8 *puVar11;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  XMLSize_t XVar12;
  DOMStringPoolEntry *pDVar13;
  XMLSize_t XVar14;
  XMLCh *pXVar15;
  XMLCh XVar16;
  XMLCh *src;
  DOMDocumentImpl *this_01;
  int colon_count;
  DOMStringPoolEntry *pDVar8;
  
  pDVar3 = (this->super_DOMElementImpl).fParent.fOwnerDocument;
  this_01 = (DOMDocumentImpl *)&pDVar3[-1].super_DOMNode;
  if (pDVar3 == (DOMDocument *)0x0) {
    this_01 = (DOMDocumentImpl *)0x0;
  }
  iVar6 = 0;
  if (qualifiedName == (XMLCh *)0x0) {
    pXVar9 = (XMLCh *)0x0;
  }
  else {
    lVar10 = 0;
    do {
      psVar1 = (short *)((long)qualifiedName + lVar10);
      lVar10 = lVar10 + 2;
    } while (*psVar1 != 0);
    uVar7 = (ulong)(ushort)*qualifiedName;
    if (uVar7 == 0) {
      uVar7 = 0;
    }
    else {
      XVar16 = qualifiedName[1];
      if (XVar16 != L'\0') {
        pXVar9 = qualifiedName + 2;
        do {
          uVar7 = (ulong)(ushort)XVar16 + (uVar7 >> 0x18) + uVar7 * 0x26;
          XVar16 = *pXVar9;
          pXVar9 = pXVar9 + 1;
        } while (XVar16 != L'\0');
      }
      uVar7 = uVar7 % this_01->fNameTableSize;
    }
    XVar14 = (lVar10 >> 1) - 1;
    pDVar8 = this_01->fNameTable[uVar7];
    if (pDVar8 == (DOMStringPoolEntry *)0x0) {
      pDVar13 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar7);
    }
    else {
      do {
        pDVar13 = pDVar8;
        if (pDVar13->fLength == XVar14) {
          pXVar9 = pDVar13->fString;
          if (pXVar9 == qualifiedName) goto LAB_0026bdeb;
          lVar10 = 0;
          do {
            psVar1 = (short *)((long)pXVar9 + lVar10);
            if (*psVar1 == 0) {
              if (*(short *)((long)qualifiedName + lVar10) == 0) goto LAB_0026bdeb;
              break;
            }
            psVar2 = (short *)((long)qualifiedName + lVar10);
            lVar10 = lVar10 + 2;
          } while (*psVar1 == *psVar2);
        }
        pDVar8 = pDVar13->fNext;
      } while (pDVar13->fNext != (DOMStringPoolEntry *)0x0);
    }
    iVar5 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                      (this_01,XVar14 * 2 + 0x18);
    pDVar8 = (DOMStringPoolEntry *)CONCAT44(extraout_var,iVar5);
    pDVar13->fNext = pDVar8;
    pDVar8->fLength = XVar14;
    pDVar8->fNext = (DOMStringPoolEntry *)0x0;
    pXVar9 = pDVar8->fString;
    XMLString::copyString(pXVar9,qualifiedName);
  }
LAB_0026bdeb:
  (this->super_DOMElementImpl).fName = pXVar9;
  XVar14 = 0xffffffff;
  uVar7 = 0;
  do {
    if (qualifiedName[uVar7] == L':') {
      iVar6 = iVar6 + 1;
      XVar14 = uVar7 & 0xffffffff;
    }
    else if (qualifiedName[uVar7] == L'\0') break;
    uVar7 = uVar7 + 1;
  } while( true );
  if (((((int)uVar7 != 0) && (iVar5 = (int)XVar14, iVar5 != 0)) && ((int)uVar7 + -1 != iVar5)) &&
     (iVar6 < 2)) {
    if (iVar5 == -1) {
      this->fPrefix = (XMLCh *)0x0;
      this->fLocalName = pXVar9;
      pXVar9 = (XMLCh *)0x0;
LAB_0026c09a:
      pXVar15 = (XMLCh *)0x0;
      if ((namespaceURI != (XMLCh *)0x0) && (*namespaceURI != L'\0')) {
        pXVar15 = namespaceURI;
      }
      pXVar9 = DOMNodeImpl::mapPrefix(pXVar9,pXVar15,1);
      if (pXVar9 == (XMLCh *)0x0) {
        pXVar15 = (XMLCh *)0x0;
      }
      else {
        lVar10 = 0;
        do {
          psVar1 = (short *)((long)pXVar9 + lVar10);
          lVar10 = lVar10 + 2;
        } while (*psVar1 != 0);
        uVar7 = (ulong)(ushort)*pXVar9;
        if (uVar7 == 0) {
          uVar7 = 0;
        }
        else {
          XVar16 = pXVar9[1];
          if (XVar16 != L'\0') {
            pXVar15 = pXVar9 + 2;
            do {
              uVar7 = (ulong)(ushort)XVar16 + (uVar7 >> 0x18) + uVar7 * 0x26;
              XVar16 = *pXVar15;
              pXVar15 = pXVar15 + 1;
            } while (XVar16 != L'\0');
          }
          uVar7 = uVar7 % this_01->fNameTableSize;
        }
        XVar14 = (lVar10 >> 1) - 1;
        pDVar8 = this_01->fNameTable[uVar7];
        if (pDVar8 == (DOMStringPoolEntry *)0x0) {
          pDVar13 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar7);
        }
        else {
          do {
            pDVar13 = pDVar8;
            if (pDVar13->fLength == XVar14) {
              pXVar15 = pDVar13->fString;
              if (pXVar15 == pXVar9) goto LAB_0026c1ae;
              lVar10 = 0;
              do {
                psVar1 = (short *)((long)pXVar15 + lVar10);
                if (*psVar1 == 0) {
                  if (*(short *)((long)pXVar9 + lVar10) == 0) goto LAB_0026c1ae;
                  break;
                }
                psVar2 = (short *)((long)pXVar9 + lVar10);
                lVar10 = lVar10 + 2;
              } while (*psVar1 == *psVar2);
            }
            pDVar8 = pDVar13->fNext;
          } while (pDVar13->fNext != (DOMStringPoolEntry *)0x0);
        }
        iVar6 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                          (this_01,XVar14 * 2 + 0x18);
        pDVar8 = (DOMStringPoolEntry *)CONCAT44(extraout_var_02,iVar6);
        pDVar13->fNext = pDVar8;
        pDVar8->fLength = XVar14;
        pDVar8->fNext = (DOMStringPoolEntry *)0x0;
        pXVar15 = pDVar8->fString;
        XMLString::copyString(pXVar15,pXVar9);
      }
LAB_0026c1ae:
      this->fNamespaceURI = pXVar15;
      return;
    }
    if (-1 < iVar5) {
      if (qualifiedName == (XMLCh *)0x0) {
        pXVar15 = (XMLCh *)0x0;
      }
      else {
        uVar7 = (ulong)(ushort)*qualifiedName;
        XVar12 = 0;
        do {
          uVar7 = (ulong)(ushort)qualifiedName[XVar12 + 1] + (uVar7 >> 0x18) + uVar7 * 0x26;
          XVar12 = XVar12 + 1;
        } while (XVar14 != XVar12);
        uVar7 = uVar7 % this_01->fNameTableSize;
        pDVar8 = this_01->fNameTable[uVar7];
        if (pDVar8 == (DOMStringPoolEntry *)0x0) {
          pDVar13 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar7);
        }
        else {
          do {
            pDVar13 = pDVar8;
            if (pDVar13->fLength == XVar14) {
              pXVar15 = pDVar13->fString;
              if (pXVar15 == qualifiedName) goto LAB_0026bf44;
              XVar12 = 0;
              while( true ) {
                XVar16 = pXVar15[XVar12];
                if ((XVar16 == L'\0') || (XVar16 != qualifiedName[XVar12])) break;
                XVar12 = XVar12 + 1;
                if (XVar14 == XVar12) goto LAB_0026bf44;
              }
              if (XVar16 == qualifiedName[XVar12]) goto LAB_0026bf44;
            }
            pDVar8 = pDVar13->fNext;
          } while (pDVar13->fNext != (DOMStringPoolEntry *)0x0);
        }
        iVar6 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                          (this_01,XVar14 * 2 + 0x18);
        pDVar8 = (DOMStringPoolEntry *)CONCAT44(extraout_var_00,iVar6);
        pDVar13->fNext = pDVar8;
        pDVar8->fLength = XVar14;
        pDVar8->fNext = (DOMStringPoolEntry *)0x0;
        pXVar15 = pDVar8->fString;
        XMLString::copyNString(pXVar15,qualifiedName,XVar14);
        pXVar9 = (this->super_DOMElementImpl).fName;
      }
LAB_0026bf44:
      this->fPrefix = pXVar15;
      src = pXVar9 + XVar14 + 1;
      lVar10 = 0;
      do {
        psVar1 = (short *)((long)src + lVar10);
        lVar10 = lVar10 + 2;
      } while (*psVar1 != 0);
      uVar7 = (ulong)(ushort)*src;
      if (uVar7 == 0) {
        uVar7 = 0;
      }
      else {
        XVar16 = pXVar9[XVar14 + 2];
        if (XVar16 != L'\0') {
          pXVar9 = pXVar9 + XVar14 + 3;
          do {
            uVar7 = (ulong)(ushort)XVar16 + (uVar7 >> 0x18) + uVar7 * 0x26;
            XVar16 = *pXVar9;
            pXVar9 = pXVar9 + 1;
          } while (XVar16 != L'\0');
        }
        uVar7 = uVar7 % this_01->fNameTableSize;
      }
      XVar14 = (lVar10 >> 1) - 1;
      pDVar8 = this_01->fNameTable[uVar7];
      if (pDVar8 == (DOMStringPoolEntry *)0x0) {
        pDVar13 = (DOMStringPoolEntry *)(this_01->fNameTable + uVar7);
      }
      else {
        do {
          pDVar13 = pDVar8;
          if (pDVar13->fLength == XVar14) {
            pXVar9 = pDVar13->fString;
            if (pXVar9 == src) goto LAB_0026c062;
            lVar10 = 0;
            do {
              psVar1 = (short *)((long)pXVar9 + lVar10);
              if (*psVar1 == 0) {
                if (*(short *)((long)src + lVar10) == 0) goto LAB_0026c062;
                break;
              }
              psVar2 = (short *)((long)src + lVar10);
              lVar10 = lVar10 + 2;
            } while (*psVar1 == *psVar2);
          }
          pDVar8 = pDVar13->fNext;
        } while (pDVar13->fNext != (DOMStringPoolEntry *)0x0);
      }
      iVar6 = (*(this_01->super_DOMMemoryManager)._vptr_DOMMemoryManager[4])
                        (this_01,XVar14 * 2 + 0x18);
      pDVar8 = (DOMStringPoolEntry *)CONCAT44(extraout_var_01,iVar6);
      pDVar13->fNext = pDVar8;
      pDVar8->fLength = XVar14;
      pDVar8->fNext = (DOMStringPoolEntry *)0x0;
      pXVar9 = pDVar8->fString;
      XMLString::copyString(pXVar9,src);
      pXVar15 = this->fPrefix;
LAB_0026c062:
      this->fLocalName = pXVar9;
      bVar4 = DOMDocumentImpl::isXMLName(this_01,pXVar15);
      if ((bVar4) && (bVar4 = DOMDocumentImpl::isXMLName(this_01,this->fLocalName), bVar4)) {
        pXVar9 = this->fPrefix;
        goto LAB_0026c09a;
      }
      this_00 = (DOMException *)__cxa_allocate_exception(0x28);
      iVar6 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])
                        (this);
      if (CONCAT44(extraout_var_04,iVar6) == 0) {
        puVar11 = &XMLPlatformUtils::fgMemoryManager;
      }
      else {
        iVar6 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])();
        puVar11 = (undefined8 *)(CONCAT44(extraout_var_06,iVar6) + 0x158);
      }
      DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar11);
      goto LAB_0026c259;
    }
  }
  this_00 = (DOMException *)__cxa_allocate_exception(0x28);
  iVar6 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])(this);
  if (CONCAT44(extraout_var_03,iVar6) == 0) {
    puVar11 = &XMLPlatformUtils::fgMemoryManager;
  }
  else {
    iVar6 = (*(this->super_DOMElementImpl).super_DOMElement.super_DOMNode._vptr_DOMNode[0xc])();
    puVar11 = (undefined8 *)(CONCAT44(extraout_var_05,iVar6) + 0x158);
  }
  DOMException::DOMException(this_00,0xe,0,(MemoryManager *)*puVar11);
LAB_0026c259:
  __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
}

Assistant:

void DOMElementNSImpl::setName(const XMLCh *namespaceURI,
                               const XMLCh *qualifiedName)
{
    DOMDocumentImpl* ownerDoc = (DOMDocumentImpl *) fParent.fOwnerDocument;
    this->fName = ownerDoc->getPooledString(qualifiedName);

    int index = DOMDocumentImpl::indexofQualifiedName(qualifiedName);
    if (index < 0)
        throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);

    if (index == 0)
    {
        //qualifiedName contains no ':'
        //
        fPrefix = 0;
        fLocalName = fName;
    }
    else
    {	//0 < index < this->name.length()-1
        //
        fPrefix = ownerDoc->getPooledNString(qualifiedName, index);
        fLocalName = ownerDoc->getPooledString(fName+index+1);

        // Before we carry on, we should check if the prefix or localName are valid XMLName
        if (!ownerDoc->isXMLName(fPrefix) || !ownerDoc->isXMLName(fLocalName))
          throw DOMException(DOMException::NAMESPACE_ERR, 0, GetDOMNodeMemoryManager);
    }

    // DOM Level 3: namespace URI is never empty string.
    //
    const XMLCh * URI = DOMNodeImpl::mapPrefix (
      fPrefix,
      (!namespaceURI || !*namespaceURI) ? 0 : namespaceURI,
      DOMNode::ELEMENT_NODE);

    fNamespaceURI = (URI == 0) ? 0 : ownerDoc->getPooledString(URI);
}